

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void help(void)

{
  fwrite("-O [filename] Exceedance Probability Table (EPT)\n",0x31,1,_stderr);
  fwrite("-o [filename] Per Sample Exceedance Probability Table (PSEPT)\n",0x3e,1,_stderr);
  fwrite("-P [filename] EPT output in parquet format\n",0x2b,1,_stderr);
  fwrite("-p [filename] PSEPT output in parquet format\n",0x2d,1,_stderr);
  fwrite("-F Aggregate Full Uncertainty\n",0x1e,1,_stderr);
  fwrite("-W Aggregate Wheatsheaf\n",0x18,1,_stderr);
  fwrite("-S Aggregate Sample Mean\n",0x19,1,_stderr);
  fwrite("-M Aggregate Wheatsheaf mean\n",0x1d,1,_stderr);
  fwrite("-f Occurrence Full Uncertainty\n",0x1f,1,_stderr);
  fwrite("-w Occurrence Wheatsheaf\n",0x19,1,_stderr);
  fwrite("-s Occurrence Sample Mean\n",0x1a,1,_stderr);
  fwrite("-m Occurrence Wheatsheaf mean\n",0x1e,1,_stderr);
  fwrite("-K [directory] Workspace sub folder\n",0x24,1,_stderr);
  fwrite("-r Use return period file\n",0x1a,1,_stderr);
  fwrite("-H Skip header\n",0xf,1,_stderr);
  fwrite("-h help\n",8,1,_stderr);
  fwrite("-v version\n",0xb,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr, "-O [filename] Exceedance Probability Table (EPT)\n");
	fprintf(stderr, "-o [filename] Per Sample Exceedance Probability Table (PSEPT)\n");
	fprintf(stderr, "-P [filename] EPT output in parquet format\n");
	fprintf(stderr, "-p [filename] PSEPT output in parquet format\n");
	fprintf(stderr, "-F Aggregate Full Uncertainty\n");
	fprintf(stderr, "-W Aggregate Wheatsheaf\n");
	fprintf(stderr, "-S Aggregate Sample Mean\n");
	fprintf(stderr, "-M Aggregate Wheatsheaf mean\n");
	fprintf(stderr, "-f Occurrence Full Uncertainty\n");
	fprintf(stderr, "-w Occurrence Wheatsheaf\n");
	fprintf(stderr, "-s Occurrence Sample Mean\n");
	fprintf(stderr, "-m Occurrence Wheatsheaf mean\n");
	fprintf(stderr, "-K [directory] Workspace sub folder\n");
	fprintf(stderr, "-r Use return period file\n");
	fprintf(stderr, "-H Skip header\n");
	fprintf(stderr, "-h help\n");
	fprintf(stderr, "-v version\n");
}